

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<int>::copy(btAlignedObjectArray<int> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int *piVar1;
  long in_RCX;
  int i;
  long lVar2;
  
  piVar1 = this->m_data;
  for (lVar2 = (long)(int)dst; lVar2 < (int)src; lVar2 = lVar2 + 1) {
    *(int *)(in_RCX + lVar2 * 4) = piVar1[lVar2];
  }
  return (int)piVar1;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}